

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void asm_snap_prep(ASMState *as)

{
  int iVar1;
  IRIns *pIVar2;
  IRIns *ir;
  ASMState *as_local;
  
  if (as->snapalloc == 0) {
    while (as->snaprename < as->T->nins) {
      pIVar2 = as->T->ir + as->snaprename;
      iVar1 = asm_snap_checkrename(as,(uint)(pIVar2->field_0).op1);
      if (iVar1 != 0) {
        (pIVar2->field_0).op2 = 0x7fff;
      }
      as->snaprename = as->snaprename + 1;
    }
  }
  else {
    as->snapalloc = 0;
    asm_snap_alloc(as,as->snapno);
    as->snaprename = as->T->nins;
  }
  return;
}

Assistant:

static void asm_snap_prep(ASMState *as)
{
  if (as->snapalloc) {
    /* Alloc on first invocation for each snapshot. */
    as->snapalloc = 0;
    asm_snap_alloc(as, as->snapno);
    as->snaprename = as->T->nins;
  } else {
    /* Check any renames above the highwater mark. */
    for (; as->snaprename < as->T->nins; as->snaprename++) {
      IRIns *ir = &as->T->ir[as->snaprename];
      if (asm_snap_checkrename(as, ir->op1))
	ir->op2 = REF_BIAS-1;  /* Kill rename. */
    }
  }
}